

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.c
# Opt level: O2

void fdct4x4_new_sse2(__m128i *input,__m128i *output,int8_t cos_bit)

{
  uint uVar1;
  uint uVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  long lVar19;
  undefined3 in_register_00000011;
  int iVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  __m128i alVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  
  auVar24 = ZEXT416(CONCAT31(in_register_00000011,cos_bit));
  lVar19 = (long)(int)CONCAT31(in_register_00000011,cos_bit) * 0x100;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar19 + 0x1a0);
  uVar2 = *(uint *)((long)vert_filter_length_chroma + lVar19 + 0x1e0);
  uVar22 = uVar2 & 0xffff;
  iVar20 = uVar22 * 0x10001;
  auVar25._4_4_ = iVar20;
  auVar25._0_4_ = iVar20;
  auVar25._8_4_ = iVar20;
  auVar25._12_4_ = iVar20;
  iVar23 = uVar22 + uVar2 * -0x10000;
  uVar2 = *(uint *)((long)vert_filter_length_chroma + lVar19 + 0x220);
  uVar22 = uVar2 << 0x10 | uVar1 & 0xffff;
  auVar28._4_4_ = uVar22;
  auVar28._0_4_ = uVar22;
  auVar28._8_4_ = uVar22;
  auVar28._12_4_ = uVar22;
  iVar21 = (uVar2 & 0xffff) + uVar1 * -0x10000;
  iVar20 = 1 << (cos_bit - 1U & 0x1f);
  sVar3 = (short)(*input)[0];
  sVar4 = *(short *)((long)*input + 2);
  sVar5 = *(short *)((long)*input + 4);
  sVar6 = *(short *)((long)*input + 6);
  sVar7 = (short)input[3][0];
  sVar8 = *(short *)((long)input[3] + 2);
  sVar9 = *(short *)((long)input[3] + 4);
  sVar10 = *(short *)((long)input[3] + 6);
  sVar11 = (short)input[1][0];
  sVar12 = *(short *)((long)input[1] + 2);
  sVar13 = *(short *)((long)input[1] + 4);
  sVar14 = *(short *)((long)input[1] + 6);
  sVar15 = (short)input[2][0];
  sVar16 = *(short *)((long)input[2] + 2);
  sVar17 = *(short *)((long)input[2] + 4);
  sVar18 = *(short *)((long)input[2] + 6);
  auVar33._0_2_ = sVar7 + sVar3;
  auVar33._2_2_ = sVar15 + sVar11;
  auVar33._4_2_ = sVar8 + sVar4;
  auVar33._6_2_ = sVar16 + sVar12;
  auVar33._8_2_ = sVar9 + sVar5;
  auVar33._10_2_ = sVar17 + sVar13;
  auVar33._12_2_ = sVar10 + sVar6;
  auVar33._14_2_ = sVar18 + sVar14;
  auVar30._0_2_ = sVar3 - sVar7;
  auVar30._2_2_ = sVar11 - sVar15;
  auVar30._4_2_ = sVar4 - sVar8;
  auVar30._6_2_ = sVar12 - sVar16;
  auVar30._8_2_ = sVar5 - sVar9;
  auVar30._10_2_ = sVar13 - sVar17;
  auVar30._12_2_ = sVar6 - sVar10;
  auVar30._14_2_ = sVar14 - sVar18;
  auVar25 = pmaddwd(auVar25,auVar33);
  auVar29._4_4_ = iVar23;
  auVar29._0_4_ = iVar23;
  auVar29._8_4_ = iVar23;
  auVar29._12_4_ = iVar23;
  auVar34 = pmaddwd(auVar33,auVar29);
  auVar29 = pmaddwd(auVar28,auVar30);
  auVar31._4_4_ = iVar21;
  auVar31._0_4_ = iVar21;
  auVar31._8_4_ = iVar21;
  auVar31._12_4_ = iVar21;
  auVar31 = pmaddwd(auVar30,auVar31);
  auVar26._0_4_ = auVar25._0_4_ + iVar20 >> auVar24;
  auVar26._4_4_ = auVar25._4_4_ + iVar20 >> auVar24;
  auVar26._8_4_ = auVar25._8_4_ + iVar20 >> auVar24;
  auVar26._12_4_ = auVar25._12_4_ + iVar20 >> auVar24;
  auVar35._0_4_ = auVar34._0_4_ + iVar20 >> auVar24;
  auVar35._4_4_ = auVar34._4_4_ + iVar20 >> auVar24;
  auVar35._8_4_ = auVar34._8_4_ + iVar20 >> auVar24;
  auVar35._12_4_ = auVar34._12_4_ + iVar20 >> auVar24;
  auVar34._0_4_ = auVar29._0_4_ + iVar20 >> auVar24;
  auVar34._4_4_ = auVar29._4_4_ + iVar20 >> auVar24;
  auVar34._8_4_ = auVar29._8_4_ + iVar20 >> auVar24;
  auVar34._12_4_ = auVar29._12_4_ + iVar20 >> auVar24;
  auVar32._0_4_ = auVar31._0_4_ + iVar20 >> auVar24;
  auVar32._4_4_ = auVar31._4_4_ + iVar20 >> auVar24;
  auVar32._8_4_ = auVar31._8_4_ + iVar20 >> auVar24;
  auVar32._12_4_ = auVar31._12_4_ + iVar20 >> auVar24;
  alVar27 = (__m128i)packssdw(auVar26,auVar35);
  *output = alVar27;
  alVar27 = (__m128i)packssdw(auVar34,auVar32);
  output[1] = alVar27;
  alVar27 = (__m128i)packssdw(auVar35,(undefined1  [16])0x0);
  output[2] = alVar27;
  alVar27 = (__m128i)packssdw(auVar32,(undefined1  [16])0x0);
  output[3] = alVar27;
  return;
}

Assistant:

static void fdct4x4_new_sse2(const __m128i *input, __m128i *output,
                             int8_t cos_bit) {
  const int32_t *cospi = cospi_arr(cos_bit);
  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  const __m128i cospi_p32_m32 = pair_set_epi16(cospi[32], -cospi[32]);
  const __m128i cospi_p16_p48 = pair_set_epi16(cospi[16], cospi[48]);
  const __m128i cospi_p48_m16 = pair_set_epi16(cospi[48], -cospi[16]);
  const __m128i __rounding = _mm_set1_epi32(1 << (cos_bit - 1));
  __m128i u[4], v[4];

  u[0] = _mm_unpacklo_epi16(input[0], input[1]);
  u[1] = _mm_unpacklo_epi16(input[3], input[2]);

  v[0] = _mm_add_epi16(u[0], u[1]);
  v[1] = _mm_sub_epi16(u[0], u[1]);

  u[0] = _mm_madd_epi16(v[0], cospi_p32_p32);  // 0
  u[1] = _mm_madd_epi16(v[0], cospi_p32_m32);  // 2
  u[2] = _mm_madd_epi16(v[1], cospi_p16_p48);  // 1
  u[3] = _mm_madd_epi16(v[1], cospi_p48_m16);  // 3

  v[0] = _mm_add_epi32(u[0], __rounding);
  v[1] = _mm_add_epi32(u[1], __rounding);
  v[2] = _mm_add_epi32(u[2], __rounding);
  v[3] = _mm_add_epi32(u[3], __rounding);
  u[0] = _mm_srai_epi32(v[0], cos_bit);
  u[1] = _mm_srai_epi32(v[1], cos_bit);
  u[2] = _mm_srai_epi32(v[2], cos_bit);
  u[3] = _mm_srai_epi32(v[3], cos_bit);

  output[0] = _mm_packs_epi32(u[0], u[1]);
  output[1] = _mm_packs_epi32(u[2], u[3]);
  output[2] = _mm_srli_si128(output[0], 8);
  output[3] = _mm_srli_si128(output[1], 8);
}